

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void booke206_invalidate_ea_tlb(CPUPPCState_conflict2 *env,int tlbn,uint32_t ea)

{
  int iVar1;
  ppcmas_tlb_t *tlb_00;
  hwaddr hVar2;
  ppcmas_tlb_t *tlb;
  target_ulong mask;
  int ways;
  int i;
  uint32_t ea_local;
  int tlbn_local;
  CPUPPCState_conflict2 *env_local;
  
  iVar1 = booke206_tlb_ways(env,tlbn);
  for (mask._4_4_ = 0; mask._4_4_ < iVar1; mask._4_4_ = mask._4_4_ + 1) {
    tlb_00 = booke206_get_tlbm(env,tlbn,(ulong)ea,mask._4_4_);
    if (((tlb_00 != (ppcmas_tlb_t *)0x0) &&
        (hVar2 = booke206_tlb_to_page_size(env,tlb_00),
        (tlb_00->mas2 & 0xfffffffffffff000) == ((ulong)ea & (hVar2 - 1 ^ 0xffffffffffffffff)))) &&
       ((tlb_00->mas1 & 0x40000000) == 0)) {
      tlb_00->mas1 = tlb_00->mas1 & 0x7fffffff;
    }
  }
  return;
}

Assistant:

static inline void booke206_invalidate_ea_tlb(CPUPPCState *env, int tlbn,
                                              uint32_t ea)
{
    int i;
    int ways = booke206_tlb_ways(env, tlbn);
    target_ulong mask;

    for (i = 0; i < ways; i++) {
        ppcmas_tlb_t *tlb = booke206_get_tlbm(env, tlbn, ea, i);
        if (!tlb) {
            continue;
        }
        mask = ~(booke206_tlb_to_page_size(env, tlb) - 1);
        if (((tlb->mas2 & MAS2_EPN_MASK) == (ea & mask)) &&
            !(tlb->mas1 & MAS1_IPROT)) {
            tlb->mas1 &= ~MAS1_VALID;
        }
    }
}